

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O1

void __thiscall
MultiBodyInplaceSolverIslandCallback::setup
          (MultiBodyInplaceSolverIslandCallback *this,btContactSolverInfo *solverInfo,
          btTypedConstraint **sortedConstraints,int numConstraints,
          btMultiBodyConstraint **sortedMultiBodyConstraints,int numMultiBodyConstraints,
          btIDebugDraw *debugDrawer)

{
  int iVar1;
  btCollisionObject **ptr;
  btPersistentManifold **ptr_00;
  btTypedConstraint **ptr_01;
  btMultiBodyConstraint **ptr_02;
  long lVar2;
  
  this->m_solverInfo = solverInfo;
  this->m_multiBodySortedConstraints = sortedMultiBodyConstraints;
  this->m_numMultiBodyConstraints = numMultiBodyConstraints;
  this->m_sortedConstraints = sortedConstraints;
  this->m_numConstraints = numConstraints;
  this->m_debugDrawer = debugDrawer;
  iVar1 = (this->m_bodies).m_size;
  lVar2 = (long)iVar1;
  if ((lVar2 < 1) && (iVar1 < 0)) {
    if ((this->m_bodies).m_capacity < 0) {
      ptr = (this->m_bodies).m_data;
      if (ptr != (btCollisionObject **)0x0) {
        if ((this->m_bodies).m_ownsMemory == true) {
          btAlignedFreeInternal(ptr);
        }
        (this->m_bodies).m_data = (btCollisionObject **)0x0;
      }
      (this->m_bodies).m_ownsMemory = true;
      (this->m_bodies).m_data = (btCollisionObject **)0x0;
      (this->m_bodies).m_capacity = 0;
    }
    if (iVar1 < 0) {
      do {
        (this->m_bodies).m_data[lVar2] = (btCollisionObject *)0x0;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0);
    }
  }
  (this->m_bodies).m_size = 0;
  iVar1 = (this->m_manifolds).m_size;
  lVar2 = (long)iVar1;
  if ((lVar2 < 1) && (iVar1 < 0)) {
    if ((this->m_manifolds).m_capacity < 0) {
      ptr_00 = (this->m_manifolds).m_data;
      if (ptr_00 != (btPersistentManifold **)0x0) {
        if ((this->m_manifolds).m_ownsMemory == true) {
          btAlignedFreeInternal(ptr_00);
        }
        (this->m_manifolds).m_data = (btPersistentManifold **)0x0;
      }
      (this->m_manifolds).m_ownsMemory = true;
      (this->m_manifolds).m_data = (btPersistentManifold **)0x0;
      (this->m_manifolds).m_capacity = 0;
    }
    if (iVar1 < 0) {
      do {
        (this->m_manifolds).m_data[lVar2] = (btPersistentManifold *)0x0;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0);
    }
  }
  (this->m_manifolds).m_size = 0;
  iVar1 = (this->m_constraints).m_size;
  lVar2 = (long)iVar1;
  if ((lVar2 < 1) && (iVar1 < 0)) {
    if ((this->m_constraints).m_capacity < 0) {
      ptr_01 = (this->m_constraints).m_data;
      if (ptr_01 != (btTypedConstraint **)0x0) {
        if ((this->m_constraints).m_ownsMemory == true) {
          btAlignedFreeInternal(ptr_01);
        }
        (this->m_constraints).m_data = (btTypedConstraint **)0x0;
      }
      (this->m_constraints).m_ownsMemory = true;
      (this->m_constraints).m_data = (btTypedConstraint **)0x0;
      (this->m_constraints).m_capacity = 0;
    }
    if (iVar1 < 0) {
      do {
        (this->m_constraints).m_data[lVar2] = (btTypedConstraint *)0x0;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0);
    }
  }
  (this->m_constraints).m_size = 0;
  iVar1 = (this->m_multiBodyConstraints).m_size;
  lVar2 = (long)iVar1;
  if ((lVar2 < 1) && (iVar1 < 0)) {
    if ((this->m_multiBodyConstraints).m_capacity < 0) {
      ptr_02 = (this->m_multiBodyConstraints).m_data;
      if (ptr_02 != (btMultiBodyConstraint **)0x0) {
        if ((this->m_multiBodyConstraints).m_ownsMemory == true) {
          btAlignedFreeInternal(ptr_02);
        }
        (this->m_multiBodyConstraints).m_data = (btMultiBodyConstraint **)0x0;
      }
      (this->m_multiBodyConstraints).m_ownsMemory = true;
      (this->m_multiBodyConstraints).m_data = (btMultiBodyConstraint **)0x0;
      (this->m_multiBodyConstraints).m_capacity = 0;
    }
    if (iVar1 < 0) {
      do {
        (this->m_multiBodyConstraints).m_data[lVar2] = (btMultiBodyConstraint *)0x0;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0);
    }
  }
  (this->m_multiBodyConstraints).m_size = 0;
  return;
}

Assistant:

SIMD_FORCE_INLINE void setup ( btContactSolverInfo* solverInfo, btTypedConstraint** sortedConstraints, int numConstraints, btMultiBodyConstraint** sortedMultiBodyConstraints,	int	numMultiBodyConstraints,	btIDebugDraw* debugDrawer)
	{
		btAssert(solverInfo);
		m_solverInfo = solverInfo;

		m_multiBodySortedConstraints = sortedMultiBodyConstraints;
		m_numMultiBodyConstraints = numMultiBodyConstraints;
		m_sortedConstraints = sortedConstraints;
		m_numConstraints = numConstraints;

		m_debugDrawer = debugDrawer;
		m_bodies.resize (0);
		m_manifolds.resize (0);
		m_constraints.resize (0);
		m_multiBodyConstraints.resize(0);
	}